

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::QueueSharedDependencies
          (cmComputeLinkDepends *this,int depender_index,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *deps)

{
  bool bVar1;
  reference pcVar2;
  undefined1 local_60 [8];
  SharedDepEntry qe;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_28;
  const_iterator li;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *deps_local;
  int depender_index_local;
  cmComputeLinkDepends *this_local;
  
  li._M_current = (cmLinkItem *)deps;
  local_28._M_current =
       (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(deps);
  while( true ) {
    qe._40_8_ = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                          ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)li._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                        *)&qe.DependerIndex);
    if (!bVar1) break;
    SharedDepEntry::SharedDepEntry((SharedDepEntry *)local_60);
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
             ::operator*(&local_28);
    cmLinkItem::operator=((cmLinkItem *)local_60,pcVar2);
    qe.Item.Target._0_4_ = depender_index;
    std::
    queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
    ::push(&this->SharedDepQueue,(value_type *)local_60);
    SharedDepEntry::~SharedDepEntry((SharedDepEntry *)local_60);
    __gnu_cxx::
    __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
    operator++(&local_28);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::QueueSharedDependencies(
  int depender_index, std::vector<cmLinkItem> const& deps)
{
  for (std::vector<cmLinkItem>::const_iterator li = deps.begin();
       li != deps.end(); ++li) {
    SharedDepEntry qe;
    qe.Item = *li;
    qe.DependerIndex = depender_index;
    this->SharedDepQueue.push(qe);
  }
}